

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O1

easm_expr * getrbf(rbitfield *bf,ull *a,ull *m)

{
  int iVar1;
  int iVar2;
  anon_enum_32 aVar3;
  int iVar4;
  int iVar5;
  easm_expr *peVar6;
  easm_expr *peVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong num;
  long lVar13;
  
  iVar5 = bf->shr;
  lVar10 = 0;
  num = 0;
  do {
    iVar1 = bf->sbf[lVar10].pos;
    iVar4 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar4 = iVar1;
    }
    iVar2 = bf->sbf[lVar10].len;
    uVar12 = ~(-1L << ((byte)iVar2 & 0x3f));
    bVar8 = (byte)(iVar1 % 0x40);
    uVar11 = uVar12 << (bVar8 & 0x3f);
    lVar13 = (long)(iVar4 >> 6);
    m[lVar13] = m[lVar13] | uVar11;
    uVar11 = (uVar11 & a[lVar13]) >> (bVar8 & 0x3f);
    if (0x40 < iVar1 % 0x40 + iVar2) {
      uVar12 = uVar12 >> (-bVar8 & 0x3f);
      m[lVar13 + 1] = m[lVar13 + 1] | uVar12;
      uVar11 = uVar11 | (uVar12 & a[lVar13 + 1]) << (-bVar8 & 0x3f);
    }
    num = num | uVar11 << ((byte)iVar5 & 0x3f);
    iVar5 = iVar5 + iVar2;
    lVar10 = lVar10 + 1;
  } while (lVar10 == 1);
  aVar3 = bf->mode;
  bVar8 = (byte)iVar5;
  if (aVar3 != RBF_ULTRASIGNED) {
    if (aVar3 == RBF_SLIGHTLY_SIGNED) {
      if ((num >> ((ulong)(byte)(bVar8 - 1) & 0x3f) & 1) == 0) goto LAB_002689c8;
      bVar9 = bVar8 - 2;
    }
    else {
      if (aVar3 != RBF_SIGNED) goto LAB_002689c8;
      bVar9 = bVar8 - 1;
    }
    if ((num >> ((ulong)bVar9 & 0x3f) & 1) == 0) goto LAB_002689c8;
  }
  num = num + (-1L << (bVar8 & 0x3f));
LAB_002689c8:
  if (bf->pcrel == 0) {
    peVar6 = easm_expr_num(EASM_EXPR_NUM,num + bf->addend);
    return peVar6;
  }
  peVar6 = easm_expr_simple(EASM_EXPR_POS);
  if (bf->pospreadd != 0) {
    peVar7 = easm_expr_num(EASM_EXPR_NUM,bf->pospreadd);
    peVar6 = easm_expr_bin(EASM_EXPR_ADD,peVar6,peVar7);
  }
  if (bf->shr != 0) {
    peVar7 = easm_expr_num(EASM_EXPR_NUM,-1L << ((byte)bf->shr & 0x3f));
    peVar6 = easm_expr_bin(EASM_EXPR_AND,peVar6,peVar7);
  }
  peVar7 = easm_expr_num(EASM_EXPR_NUM,num);
  peVar6 = easm_expr_bin(EASM_EXPR_ADD,peVar6,peVar7);
  if (bf->addend != 0) {
    peVar7 = easm_expr_num(EASM_EXPR_NUM,bf->addend);
    peVar6 = easm_expr_bin(EASM_EXPR_ADD,peVar6,peVar7);
    return peVar6;
  }
  return peVar6;
}

Assistant:

struct easm_expr *getrbf(const struct rbitfield *bf, ull *a, ull *m) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case RBF_UNSIGNED:
			break;
		case RBF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case RBF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case RBF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
	}
	if (bf->pcrel) {
		struct easm_expr *expr = easm_expr_simple(EASM_EXPR_POS);
		if (bf->pospreadd)
			expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, bf->pospreadd));
		if (bf->shr)
			expr = easm_expr_bin(EASM_EXPR_AND, expr, easm_expr_num(EASM_EXPR_NUM, -(1ull << bf->shr)));
		expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, res));
		if (bf->addend)
			expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, bf->addend));
		return expr;
	} else {
		res += bf->addend;
		return easm_expr_num(EASM_EXPR_NUM, res);
	}
}